

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.h
# Opt level: O2

uint8_t * icu_63::BytesTrie::skipDelta(uint8_t *pos)

{
  byte bVar1;
  uint8_t *puVar2;
  
  bVar1 = *pos;
  if (bVar1 < 0xc0) {
    return pos + 1;
  }
  if (bVar1 < 0xf0) {
    puVar2 = pos + 2;
  }
  else {
    if (0xfd < bVar1) {
      return pos + 1 + (ulong)(bVar1 & 1) + 3;
    }
    puVar2 = pos + 3;
  }
  return puVar2;
}

Assistant:

static inline const uint8_t *skipDelta(const uint8_t *pos) {
        int32_t delta=*pos++;
        if(delta>=kMinTwoByteDeltaLead) {
            if(delta<kMinThreeByteDeltaLead) {
                ++pos;
            } else if(delta<kFourByteDeltaLead) {
                pos+=2;
            } else {
                pos+=3+(delta&1);
            }
        }
        return pos;
    }